

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpFileInfo.c
# Opt level: O3

int UpnpFileInfo_assign(UpnpFileInfo *p,UpnpFileInfo *q)

{
  time_t tVar1;
  UpnpListHead *pUVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  int iVar9;
  uint uVar10;
  char *s;
  long lVar11;
  sockaddr_storage *psVar12;
  sockaddr_storage *psVar13;
  byte bVar14;
  
  bVar14 = 0;
  if (p != q) {
    tVar1 = q->m_LastModified;
    p->m_FileLength = q->m_FileLength;
    p->m_LastModified = tVar1;
    iVar9 = q->m_IsReadable;
    p->m_IsDirectory = q->m_IsDirectory;
    p->m_IsReadable = iVar9;
    iVar9 = UpnpFileInfo_set_ContentType(p,q->m_ContentType);
    if (iVar9 == 0) {
      uVar10 = 0;
    }
    else {
      pUVar2 = (q->m_ExtraHeadersList).prev;
      (p->m_ExtraHeadersList).next = (q->m_ExtraHeadersList).next;
      (p->m_ExtraHeadersList).prev = pUVar2;
      psVar12 = &q->m_CtrlPtIPAddr;
      psVar13 = &p->m_CtrlPtIPAddr;
      for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
        cVar3 = psVar12->__ss_padding[0];
        cVar4 = psVar12->__ss_padding[1];
        cVar5 = psVar12->__ss_padding[2];
        cVar6 = psVar12->__ss_padding[3];
        cVar7 = psVar12->__ss_padding[4];
        cVar8 = psVar12->__ss_padding[5];
        psVar13->ss_family = psVar12->ss_family;
        psVar13->__ss_padding[0] = cVar3;
        psVar13->__ss_padding[1] = cVar4;
        psVar13->__ss_padding[2] = cVar5;
        psVar13->__ss_padding[3] = cVar6;
        psVar13->__ss_padding[4] = cVar7;
        psVar13->__ss_padding[5] = cVar8;
        psVar12 = (sockaddr_storage *)((long)psVar12 + (ulong)bVar14 * -0x10 + 8);
        psVar13 = (sockaddr_storage *)((long)psVar13 + (ulong)bVar14 * -0x10 + 8);
      }
      s = UpnpString_get_String(q->m_Os);
      iVar9 = UpnpString_set_String(p->m_Os,s);
      uVar10 = (uint)(iVar9 != 0);
    }
    return uVar10;
  }
  return 1;
}

Assistant:

int UpnpFileInfo_assign(UpnpFileInfo *p, const UpnpFileInfo *q)
{
	int ok = 1;

	if (p != q) {
		ok = ok && UpnpFileInfo_set_FileLength(
				   p, UpnpFileInfo_get_FileLength(q));
		ok = ok && UpnpFileInfo_set_LastModified(
				   p, UpnpFileInfo_get_LastModified(q));
		ok = ok && UpnpFileInfo_set_IsDirectory(
				   p, UpnpFileInfo_get_IsDirectory(q));
		ok = ok && UpnpFileInfo_set_IsReadable(
				   p, UpnpFileInfo_get_IsReadable(q));
		ok = ok && UpnpFileInfo_set_ContentType(
				   p, UpnpFileInfo_get_ContentType(q));
		ok = ok && UpnpFileInfo_set_ExtraHeadersList(
				   p, UpnpFileInfo_get_ExtraHeadersList(q));
		ok = ok && UpnpFileInfo_set_CtrlPtIPAddr(
				   p, UpnpFileInfo_get_CtrlPtIPAddr(q));
		ok = ok && UpnpFileInfo_set_Os(p, UpnpFileInfo_get_Os(q));
	}

	return ok;
}